

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O0

string_view helics::fileops::removeSpaceAndComment(string_view jsonString)

{
  string_view sVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  char *in_RSI;
  size_t in_RDI;
  string_view *unaff_retaddr;
  string_view in_stack_00000008;
  size_type nextNewLine;
  undefined8 in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_20._M_len = in_RDI;
  local_20._M_str = in_RSI;
  gmlc::utilities::string_viewOps::trimString(unaff_retaddr,in_stack_00000008);
  while (((sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20), 2 < sVar2
          && (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 (&local_20,0), *pvVar3 == '/')) &&
         (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_20,1),
         *pvVar3 == '/'))) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (in_stack_ffffffffffffffb0,(char)((ulong)in_stack_ffffffffffffffa8 >> 0x38),
                       0x714d52);
    if (sVar4 == 0xffffffffffffffff) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
      goto LAB_00714df4;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_20,sVar4 + 1);
    gmlc::utilities::string_viewOps::trimString(unaff_retaddr,in_stack_00000008);
  }
  gmlc::utilities::string_viewOps::trimString(unaff_retaddr,in_stack_00000008);
  local_10._M_len = local_20._M_len;
  local_10._M_str = local_20._M_str;
LAB_00714df4:
  sVar1._M_str = local_10._M_str;
  sVar1._M_len = local_10._M_len;
  return sVar1;
}

Assistant:

static std::string_view removeSpaceAndComment(std::string_view jsonString)
{
    gmlc::utilities::string_viewOps::trimString(jsonString);
    while (jsonString.size() > 2) {
        if (jsonString[0] == '/' && jsonString[1] == '/') {
            auto nextNewLine = jsonString.find_first_of('\n');
            if (nextNewLine == std::string_view::npos) {
                return {};
            }
            jsonString.remove_prefix(nextNewLine + 1);
            gmlc::utilities::string_viewOps::trimString(jsonString);
        } else {
            break;
        }
    }
    gmlc::utilities::string_viewOps::trimString(jsonString);
    return jsonString;
}